

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall Engine::saveCurrentSolution(Engine *this)

{
  IntVar **ppIVar1;
  IntVar *pIVar2;
  ulong uVar3;
  ulong uVar4;
  
  SAT::saveCurrentPolarities(&sat);
  uVar3 = (ulong)(this->vars).sz;
  if (uVar3 != 0) {
    ppIVar1 = (this->vars).data;
    uVar4 = 0;
    do {
      pIVar2 = ppIVar1[uVar4];
      pIVar2->last_solution_value = (pIVar2->min).v;
      if (pIVar2->sbps_value_selection == false) {
        pIVar2->sbps_value_selection = true;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void Engine::saveCurrentSolution() {
	sat.saveCurrentPolarities();                      // SAT vars
	for (unsigned int i = 0; i < vars.size(); i++) {  // Int vars
		vars[i]->saveCurrentValue();
	}
}